

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  Token *__return_storage_ptr__;
  size_t *psVar1;
  Expr *pEVar2;
  ModuleField *pMVar3;
  undefined1 auVar4 [8];
  _Head_base<0UL,_wabt::Import_*,_false> _Var5;
  DataSegmentModuleField *pDVar6;
  bool bVar7;
  Result RVar8;
  Expr *pEVar9;
  ulong uVar10;
  ExprList *pEVar11;
  Enum EVar12;
  undefined1 auStack_138 [8];
  ModuleFieldList export_fields;
  undefined1 local_118 [8];
  string name;
  Location loc;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> memory_field;
  Expr *local_c8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_c0;
  size_type local_b8;
  size_t sStack_b0;
  undefined8 local_a8;
  _Head_base<0UL,_wabt::Import_*,_false> _Stack_88;
  unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> import;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_58;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_50;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_48;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_40;
  DataSegmentModuleField *local_38;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  data_segment_field;
  
  RVar8 = Expect(this,Lpar);
  if (RVar8.enum_ == Error) {
    return (Result)Error;
  }
  __return_storage_ptr__ = (Token *)((long)&loc.field_1 + 8);
  GetToken(__return_storage_ptr__,this);
  loc.filename.size_ = (size_type)local_c8;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aStack_c0.offset;
  name.field_2._8_8_ = loc.field_1._8_8_;
  loc.filename.data_ =
       (char *)memory_field._M_t.
               super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
               .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
  Token::~Token(__return_storage_ptr__);
  RVar8 = Expect(this,Memory);
  EVar12 = Error;
  if (RVar8.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  local_118 = (undefined1  [8])&name._M_string_length;
  ParseBindVarOpt(this,(string *)local_118);
  auStack_138 = (undefined1  [8])0x0;
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  RVar8 = ParseInlineExports(this,(ModuleFieldList *)auStack_138,Memory);
  auVar4 = auStack_138;
  if (RVar8.enum_ != Error) {
    bVar7 = PeekMatchLpar(this,Import);
    if (bVar7) {
      CheckImportOrdering(this,module);
      MakeUnique<wabt::MemoryImport,std::__cxx11::string&>
                ((wabt *)&stack0xffffffffffffff78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      RVar8 = ParseInlineImport(this,_Stack_88._M_head_impl);
      if ((RVar8.enum_ == Error) ||
         (RVar8 = ParseLimits(this,(Limits *)
                                   ((long)&_Stack_88._M_head_impl[1].module_name.field_2 + 8)),
         RVar8.enum_ == Error)) {
        auVar4 = auStack_138;
        if (_Stack_88._M_head_impl != (Import *)0x0) {
          (*(_Stack_88._M_head_impl)->_vptr_Import[1])();
          auVar4 = auStack_138;
        }
        goto joined_r0x00f71607;
      }
      GetLocation((Location *)((long)&loc.field_1 + 8),this);
      local_58._M_head_impl = (ImportModuleField *)operator_new(0x48);
      _Var5._M_head_impl = _Stack_88._M_head_impl;
      _Stack_88._M_head_impl = (Import *)0x0;
      ((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      ((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      ((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      _vptr_ModuleField = (_func_int **)&PTR__ModuleField_0155b078;
      ((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename.data_ = (char *)loc.field_1._8_8_;
      ((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename.size_ =
           (size_type)
           memory_field._M_t.
           super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
           .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
      ((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.field_1.field_1.offset = (size_t)local_c8;
      *(size_t *)
       ((long)&((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
               super_ModuleField.loc.field_1 + 8) = aStack_c0.offset;
      ((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      type_ = Import;
      ((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      _vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_0155b118;
      ((local_58._M_head_impl)->import)._M_t.
      super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
      super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var5._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_58);
      if (local_58._M_head_impl != (ImportModuleField *)0x0) {
        (*((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_58._M_head_impl = (ImportModuleField *)0x0;
      if (_Stack_88._M_head_impl != (Import *)0x0) {
        (*(_Stack_88._M_head_impl)->_vptr_Import[1])();
      }
    }
    else {
      bVar7 = MatchLpar(this,Data);
      if (bVar7) {
        MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>
                  ((wabt *)&local_38,(Location *)((long)&name.field_2 + 8));
        pDVar6 = local_38;
        _Stack_88._M_head_impl = (Import *)0x0;
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 0;
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_ = 0;
        Var::Var((Var *)((long)&loc.field_1 + 8),
                 (Index)((ulong)((long)(module->memories).
                                       super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->memories).
                                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),
                 (Location *)&stack0xffffffffffffff78);
        Var::operator=(&(pDVar6->data_segment).memory_var,(Var *)((long)&loc.field_1 + 8));
        Var::~Var((Var *)((long)&loc.field_1 + 8));
        _Stack_88._M_head_impl = (Import *)0x0;
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._0_4_ = 0;
        import._M_t.
        super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
        super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_ = 0;
        Const::Const((Const *)((long)&loc.field_1 + 8),0);
        pEVar9 = (Expr *)operator_new(0x78);
        *(undefined8 *)((long)&(pEVar9->loc).filename.size_ + 4) = 0;
        *(undefined8 *)((long)&(pEVar9->loc).field_1.field_1.offset + 4) = 0;
        (pEVar9->loc).filename.data_ = (char *)0x0;
        (pEVar9->loc).filename.size_ = 0;
        (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        pEVar9->type_ = Const;
        pEVar9->_vptr_Expr = (_func_int **)&PTR__Expr_0155b9c8;
        pEVar9[1]._vptr_Expr = (_func_int **)loc.field_1._8_8_;
        pEVar9[1].super_intrusive_list_base<wabt::Expr>.next_ =
             (Expr *)memory_field._M_t.
                     super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                     .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
        pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_ = local_c8;
        pEVar9[1].loc.filename.data_ = (char *)aStack_c0.offset;
        pEVar9[1].loc.filename.size_ = local_b8;
        pEVar9[1].loc.field_1.field_1.offset = sStack_b0;
        *(undefined8 *)((long)&pEVar9[1].loc.field_1 + 8) = local_a8;
        if (((pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
           ((pEVar9->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
          __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                        ,0x1bf,
                        "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                       );
        }
        pEVar2 = (pDVar6->data_segment).offset.last_;
        if (pEVar2 == (Expr *)0x0) {
          pEVar11 = &(pDVar6->data_segment).offset;
        }
        else {
          (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
          pEVar11 = (ExprList *)&pEVar2->super_intrusive_list_base<wabt::Expr>;
        }
        pEVar11->first_ = pEVar9;
        (pDVar6->data_segment).offset.last_ = pEVar9;
        psVar1 = &(pDVar6->data_segment).offset.size_;
        *psVar1 = *psVar1 + 1;
        if (*psVar1 == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                        ,0x192,
                        "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                       );
        }
        pEVar9 = (pDVar6->data_segment).offset.last_;
        (pEVar9->loc).field_1.field_1.offset = loc.filename.size_;
        ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
        ((long)&(pEVar9->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
        (pEVar9->loc).filename.data_ = (char *)name.field_2._8_8_;
        (pEVar9->loc).filename.size_ = (size_type)loc.filename.data_;
        ParseTextListOpt(this,&(pDVar6->data_segment).data);
        RVar8 = Expect(this,Rpar);
        if (RVar8.enum_ != Error) {
          MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                    ((wabt *)(loc.field_1.field2 + 8),(Location *)((long)&name.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
          ;
          uVar10 = (ulong)((*(int *)&(pDVar6->data_segment).data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(pDVar6->data_segment).data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + 0xffffU >> 0x10);
          *(ulong *)(loc.field_1._8_8_ + 0x60) = uVar10;
          *(ulong *)(loc.field_1._8_8_ + 0x68) = uVar10;
          *(undefined1 *)(loc.field_1._8_8_ + 0x70) = 1;
          local_50._M_head_impl = (MemoryModuleField *)loc.field_1._8_8_;
          loc.field_1._8_8_ = 0;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_50);
          if (local_50._M_head_impl != (MemoryModuleField *)0x0) {
            (*((local_50._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_50._M_head_impl = (MemoryModuleField *)0x0;
          local_48._M_head_impl = local_38;
          local_38 = (DataSegmentModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                      *)&local_48);
          if (local_48._M_head_impl != (DataSegmentModuleField *)0x0) {
            (*((local_48._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_48._M_head_impl = (DataSegmentModuleField *)0x0;
          if (loc.field_1._8_8_ != 0) {
            (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
          }
        }
        if (local_38 != (DataSegmentModuleField *)0x0) {
          (*(local_38->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
            _vptr_ModuleField[1])();
        }
      }
      else {
        MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
                  ((wabt *)(loc.field_1.field2 + 8),(Location *)((long)&name.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
        RVar8 = ParseLimits(this,(Limits *)(loc.field_1._8_8_ + 0x60));
        if (RVar8.enum_ != Error) {
          local_40._M_head_impl = (MemoryModuleField *)loc.field_1._8_8_;
          loc.field_1._8_8_ = 0;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_40);
          if (local_40._M_head_impl != (MemoryModuleField *)0x0) {
            (*((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_40._M_head_impl = (MemoryModuleField *)0x0;
        }
        if (loc.field_1._8_8_ != 0) {
          (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
        }
      }
      auVar4 = auStack_138;
      if (RVar8.enum_ == Error) goto joined_r0x00f71607;
    }
    anon_unknown_1::AppendInlineExportFields
              (module,(ModuleFieldList *)auStack_138,
               (int)((ulong)((long)(module->memories).
                                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(module->memories).
                                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
    RVar8 = Expect(this,Rpar);
    EVar12 = (Enum)(RVar8.enum_ == Error);
    auVar4 = auStack_138;
  }
joined_r0x00f71607:
  while (auVar4 != (undefined1  [8])0x0) {
    pMVar3 = (((ModuleField *)auVar4)->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*((ModuleField *)auVar4)->_vptr_ModuleField[1])();
    auVar4 = (undefined1  [8])pMVar3;
  }
  if (local_118 != (undefined1  [8])&name._M_string_length) {
    operator_delete((void *)local_118);
  }
  return (Result)EVar12;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (MatchLpar(TokenType::Data)) {
    auto data_segment_field = MakeUnique<DataSegmentModuleField>(loc);
    DataSegment& data_segment = data_segment_field->data_segment;
    data_segment.memory_var = Var(module->memories.size());
    data_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    data_segment.offset.back().loc = loc;
    ParseTextListOpt(&data_segment.data);
    EXPECT(Rpar);

    auto memory_field = MakeUnique<MemoryModuleField>(loc, name);
    uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
    uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
    memory_field->memory.page_limits.initial = page_size;
    memory_field->memory.page_limits.max = page_size;
    memory_field->memory.page_limits.has_max = true;

    module->AppendField(std::move(memory_field));
    module->AppendField(std::move(data_segment_field));
  } else {
    auto field = MakeUnique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->memory.page_limits));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}